

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.h
# Opt level: O1

int kputuw(uint c,kstring_t *s)

{
  byte bVar1;
  size_t sVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  char buf [16];
  undefined8 uStack_30;
  byte local_28 [24];
  
  if (c == 0) {
    uVar4 = s->l + 1;
    if (s->m <= uVar4) {
      uVar4 = uVar4 >> 1 | uVar4;
      uVar4 = uVar4 >> 2 | uVar4;
      uVar4 = uVar4 >> 4 | uVar4;
      uVar4 = uVar4 >> 8 | uVar4;
      sVar6 = (uVar4 >> 0x10 | uVar4) + 1;
      s->m = sVar6;
      uStack_30 = 0x117aa7;
      pcVar5 = (char *)realloc(s->s,sVar6);
      if (pcVar5 == (char *)0x0) goto LAB_00117acd;
      s->s = pcVar5;
    }
    sVar2 = s->l;
    s->l = sVar2 + 1;
    s->s[sVar2] = '0';
  }
  else {
    uVar4 = 1;
    do {
      uVar7 = uVar4;
      local_28[uVar7 - 1] = (char)c + (char)(c / 10) * -10 | 0x30;
      bVar3 = 9 < c;
      uVar4 = uVar7 + 1;
      c = c / 10;
    } while (bVar3);
    uVar4 = (uVar7 + 1 & 0xffffffff) + s->l;
    if (s->m <= uVar4) {
      uVar4 = uVar4 >> 1 | uVar4;
      uVar4 = uVar4 >> 2 | uVar4;
      uVar4 = uVar4 >> 4 | uVar4;
      uVar4 = uVar4 >> 8 | uVar4;
      sVar6 = (uVar4 >> 0x10 | uVar4) + 1;
      s->m = sVar6;
      uStack_30 = 0x117a24;
      pcVar5 = (char *)realloc(s->s,sVar6);
      if (pcVar5 == (char *)0x0) goto LAB_00117acd;
      s->s = pcVar5;
    }
    uVar7 = uVar7 - 1;
    do {
      bVar1 = local_28[uVar7 & 0xffffffff];
      sVar2 = s->l;
      s->l = sVar2 + 1;
      s->s[sVar2] = bVar1;
      uVar7 = uVar7 - 1;
    } while (1 < (int)uVar7 + 2);
  }
  pcVar5 = (char *)s->l;
  s->s[(long)pcVar5] = '\0';
LAB_00117acd:
  return (int)pcVar5;
}

Assistant:

static inline int kputuw(unsigned c, kstring_t *s)
{
	char buf[16];
	int l, i;
	unsigned x;
	if (c == 0) return kputc('0', s);
	for (l = 0, x = c; x > 0; x /= 10) buf[l++] = x%10 + '0';
	if (s->l + l + 1 >= s->m) {
		char *tmp;
		s->m = s->l + l + 2;
		kroundup32(s->m);
		if ((tmp = (char*)realloc(s->s, s->m)))
			s->s = tmp;
		else
			return EOF;
	}
	for (i = l - 1; i >= 0; --i) s->s[s->l++] = buf[i];
	s->s[s->l] = 0;
	return 0;
}